

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.c
# Opt level: O2

void update_joyaxis(uint8_t axis,int16_t value)

{
  ushort uVar1;
  KEYINPUT_t *pKVar2;
  int16_t *piVar3;
  ushort uVar4;
  undefined3 in_register_00000039;
  double dVar5;
  
  pKVar2 = get_keyinput();
  if (CONCAT31(in_register_00000039,axis) == 0) {
    piVar3 = &joyx;
  }
  else {
    if (CONCAT31(in_register_00000039,axis) != 1) goto LAB_00118672;
    piVar3 = &joyy;
  }
  *piVar3 = value;
LAB_00118672:
  uVar1 = -joyx;
  if (0 < joyx) {
    uVar1 = joyx;
  }
  uVar4 = -joyy;
  if (0 < joyy) {
    uVar4 = joyy;
  }
  if ((uVar1 < 8000) && (uVar4 < 8000)) {
    uVar1 = pKVar2->raw | 0xf0;
  }
  else {
    dVar5 = atan2((double)(int)joyy * -3.0517578125e-05,(double)(int)joyx * 3.0517578125e-05);
    dVar5 = (dVar5 * 180.0) / 3.141592653589793;
    dVar5 = (double)(~-(ulong)(dVar5 < 0.0) & (ulong)dVar5 |
                    (ulong)(dVar5 + 360.0) & -(ulong)(dVar5 < 0.0));
    uVar1 = (-(ushort)(67.5 <= dVar5 && dVar5 <= 292.5) & 1) << 4 |
            (-(ushort)(dVar5 <= 112.5 || 247.5 <= dVar5) & 1) << 5 |
            (-(ushort)(dVar5 <= 202.5 || 337.5 <= dVar5) & 1) << 7 |
            pKVar2->raw & 0xff0f | (-(ushort)(dVar5 <= 22.5 || 157.5 <= dVar5) & 1) << 6;
  }
  pKVar2->raw = uVar1;
  return;
}

Assistant:

void update_joyaxis(byte axis, int16_t value) {
    KEYINPUT_t* KEYINPUT = get_keyinput();
    switch (axis) {
        case SDL_CONTROLLER_AXIS_LEFTX:
            joyx = value;
            break;
        case SDL_CONTROLLER_AXIS_LEFTY:
            joyy = value;
            break;
        default:
            break;
    }

    if (abs(joyx) < 8000 && abs(joyy) < 8000) {
        KEYINPUT->left = true;
        KEYINPUT->right = true;
        KEYINPUT->up = true;
        KEYINPUT->down = true;
    } else {

        // normalize to unit circle
        double adjusted_joyx = (double)joyx / 32768;
        double adjusted_joyy = (double)joyy / -32768; // y axis is reversed from what you'd expect, so flip it back with this division

        // what direction are we pointing?
        double degrees = atan2(adjusted_joyy, adjusted_joyx) * 180 / M_PI;

        // atan2 returns negative numbers for values > 180
        if (degrees < 0) {
            degrees = 360 + degrees;
        }

        // 135 degree slices, overlapping.
        KEYINPUT->up = !CHECKSLICE(degrees, 90);
        KEYINPUT->down = !CHECKSLICE(degrees, 270);
        KEYINPUT->left = !CHECKSLICE(degrees, 180);
        // Slightly different since it's around the 0 angle
        KEYINPUT->right = !(degrees < SLICE_OFFSET || degrees > (360 - SLICE_OFFSET));
    }
}